

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

void KeccakP1600_ExtractAndAddLanes(void *state,uchar *input,uchar *output,uint laneCount)

{
  uint i;
  uint laneCount_local;
  uchar *output_local;
  uchar *input_local;
  void *state_local;
  
  for (i = 0; i < laneCount; i = i + 1) {
    *(ulong *)(output + (ulong)i * 8) =
         *(ulong *)(input + (ulong)i * 8) ^ *(ulong *)((long)state + (ulong)i * 8);
  }
  return;
}

Assistant:

void KeccakP1600_ExtractAndAddLanes(const void *state, const unsigned char *input, unsigned char *output, unsigned int laneCount)
{
    unsigned int i;
#if (PLATFORM_BYTE_ORDER != IS_LITTLE_ENDIAN)
    unsigned char temp[8];
    unsigned int j;
#endif

    for(i=0; i<laneCount; i++) {
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
        ((uint64_t*)output)[i] = ((uint64_t*)input)[i] ^ ((const uint64_t*)state)[i];
#else
        fromWordToBytes(temp, ((const uint64_t*)state)[i]);
        for(j=0; j<8; j++)
            output[i*8+j] = input[i*8+j] ^ temp[j];
#endif
    }
#ifdef KeccakP1600_useLaneComplementing
    if (laneCount > 1) {
        ((uint64_t*)output)[ 1] = ~((uint64_t*)output)[ 1];
        if (laneCount > 2) {
            ((uint64_t*)output)[ 2] = ~((uint64_t*)output)[ 2];
            if (laneCount > 8) {
                ((uint64_t*)output)[ 8] = ~((uint64_t*)output)[ 8];
                if (laneCount > 12) {
                    ((uint64_t*)output)[12] = ~((uint64_t*)output)[12];
                    if (laneCount > 17) {
                        ((uint64_t*)output)[17] = ~((uint64_t*)output)[17];
                        if (laneCount > 20) {
                            ((uint64_t*)output)[20] = ~((uint64_t*)output)[20];
                        }
                    }
                }
            }
        }
    }
#endif
}